

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.h
# Opt level: O0

bool __thiscall
clipp::parser::try_match_joined<clipp::detail::select_flags>
          (parser *this,group *joinGroup,arg_string *arg,select_flags *select,arg_string *prefix)

{
  bool *this_00;
  undefined8 __lhs;
  byte bVar1;
  bool bVar2;
  long lVar3;
  arg_string *__rhs;
  ulong uVar4;
  reference this_01;
  reference match_00;
  match_t *m;
  iterator __end2_1;
  iterator __begin2_1;
  vector<clipp::detail::match_t,_std::allocator<clipp::detail::match_t>_> *__range2_1;
  arg_mapping *a;
  iterator __end2;
  iterator __begin2;
  arg_mappings *__range2;
  scoped_dfs_traverser local_298;
  undefined1 local_1f8 [8];
  match_t match;
  vector<clipp::detail::match_t,_std::allocator<clipp::detail::match_t>_> matches;
  parser parse;
  arg_string *prefix_local;
  select_flags *select_local;
  arg_string *arg_local;
  group *joinGroup_local;
  parser *this_local;
  
  parse._224_8_ = prefix;
  parser((parser *)
         &matches.
          super__Vector_base<clipp::detail::match_t,_std::allocator<clipp::detail::match_t>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage,joinGroup,0);
  std::vector<clipp::detail::match_t,_std::allocator<clipp::detail::match_t>_>::vector
            ((vector<clipp::detail::match_t,_std::allocator<clipp::detail::match_t>_> *)
             &match.pos_.ignoreBlocks_);
  do {
    bVar1 = std::__cxx11::string::empty();
    if (((bVar1 ^ 0xff) & 1) == 0) {
      uVar4 = std::__cxx11::string::empty();
      if (((uVar4 & 1) == 0) ||
         (bVar2 = std::vector<clipp::detail::match_t,_std::allocator<clipp::detail::match_t>_>::
                  empty((vector<clipp::detail::match_t,_std::allocator<clipp::detail::match_t>_> *)
                        &match.pos_.ignoreBlocks_), bVar2)) {
        this_local._7_1_ = 0;
      }
      else {
        bVar2 = std::
                vector<clipp::parser::miss_candidate,_std::allocator<clipp::parser::miss_candidate>_>
                ::empty((vector<clipp::parser::miss_candidate,_std::allocator<clipp::parser::miss_candidate>_>
                         *)&parse.args_.
                            super__Vector_base<clipp::parser::arg_mapping,_std::allocator<clipp::parser::arg_mapping>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
        if (bVar2) {
          __end2 = std::
                   vector<clipp::parser::arg_mapping,_std::allocator<clipp::parser::arg_mapping>_>::
                   begin((vector<clipp::parser::arg_mapping,_std::allocator<clipp::parser::arg_mapping>_>
                          *)&parse.index_);
          a = (arg_mapping *)
              std::vector<clipp::parser::arg_mapping,_std::allocator<clipp::parser::arg_mapping>_>::
              end((vector<clipp::parser::arg_mapping,_std::allocator<clipp::parser::arg_mapping>_> *
                  )&parse.index_);
          goto LAB_0011e703;
        }
        this_local._7_1_ = 0;
      }
      break;
    }
    detail::scoped_dfs_traverser::scoped_dfs_traverser(&local_298,(scoped_dfs_traverser *)&parse);
    detail::longest_prefix_match<clipp::detail::select_flags>
              ((match_t *)local_1f8,&local_298,arg,select);
    detail::scoped_dfs_traverser::~scoped_dfs_traverser(&local_298);
    bVar2 = detail::match_t::operator_cast_to_bool((match_t *)local_1f8);
    if (bVar2) {
      detail::match_t::str_abi_cxx11_((match_t *)local_1f8);
      std::__cxx11::string::size();
      std::__cxx11::string::erase((ulong)arg,0);
      uVar4 = std::__cxx11::string::empty();
      if ((((uVar4 & 1) == 0) && (uVar4 = std::__cxx11::string::empty(), (uVar4 & 1) == 0)) &&
         (lVar3 = std::__cxx11::string::find((string *)arg,parse._224_8_), __lhs = parse._224_8_,
         lVar3 != 0)) {
        __rhs = detail::match_t::str_abi_cxx11_((match_t *)local_1f8);
        bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )__lhs,__rhs);
        if (bVar2) {
          std::__cxx11::string::insert((ulong)arg,(string *)0x0);
        }
      }
      add_match((parser *)
                &matches.
                 super__Vector_base<clipp::detail::match_t,_std::allocator<clipp::detail::match_t>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,(match_t *)local_1f8);
      std::vector<clipp::detail::match_t,_std::allocator<clipp::detail::match_t>_>::push_back
                ((vector<clipp::detail::match_t,_std::allocator<clipp::detail::match_t>_> *)
                 &match.pos_.ignoreBlocks_,(value_type *)local_1f8);
      bVar2 = false;
    }
    else {
      this_local._7_1_ = 0;
      bVar2 = true;
    }
    detail::match_t::~match_t((match_t *)local_1f8);
  } while (!bVar2);
LAB_0011e7f7:
  std::vector<clipp::detail::match_t,_std::allocator<clipp::detail::match_t>_>::~vector
            ((vector<clipp::detail::match_t,_std::allocator<clipp::detail::match_t>_> *)
             &match.pos_.ignoreBlocks_);
  ~parser((parser *)
          &matches.
           super__Vector_base<clipp::detail::match_t,_std::allocator<clipp::detail::match_t>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage);
  return (bool)(this_local._7_1_ & 1);
LAB_0011e703:
  bVar2 = __gnu_cxx::operator!=
                    (&__end2,(__normal_iterator<clipp::parser::arg_mapping_*,_std::vector<clipp::parser::arg_mapping,_std::allocator<clipp::parser::arg_mapping>_>_>
                              *)&a);
  if (!bVar2) goto LAB_0011e764;
  this_01 = __gnu_cxx::
            __normal_iterator<clipp::parser::arg_mapping_*,_std::vector<clipp::parser::arg_mapping,_std::allocator<clipp::parser::arg_mapping>_>_>
            ::operator*(&__end2);
  bVar2 = arg_mapping::any_error(this_01);
  if (bVar2) {
    this_local._7_1_ = 0;
    goto LAB_0011e7f7;
  }
  __gnu_cxx::
  __normal_iterator<clipp::parser::arg_mapping_*,_std::vector<clipp::parser::arg_mapping,_std::allocator<clipp::parser::arg_mapping>_>_>
  ::operator++(&__end2);
  goto LAB_0011e703;
LAB_0011e764:
  this_00 = &match.pos_.ignoreBlocks_;
  __end2_1 = std::vector<clipp::detail::match_t,_std::allocator<clipp::detail::match_t>_>::begin
                       ((vector<clipp::detail::match_t,_std::allocator<clipp::detail::match_t>_> *)
                        this_00);
  m = (match_t *)
      std::vector<clipp::detail::match_t,_std::allocator<clipp::detail::match_t>_>::end
                ((vector<clipp::detail::match_t,_std::allocator<clipp::detail::match_t>_> *)this_00)
  ;
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end2_1,
                            (__normal_iterator<clipp::detail::match_t_*,_std::vector<clipp::detail::match_t,_std::allocator<clipp::detail::match_t>_>_>
                             *)&m), bVar2) {
    match_00 = __gnu_cxx::
               __normal_iterator<clipp::detail::match_t_*,_std::vector<clipp::detail::match_t,_std::allocator<clipp::detail::match_t>_>_>
               ::operator*(&__end2_1);
    add_match(this,match_00);
    __gnu_cxx::
    __normal_iterator<clipp::detail::match_t_*,_std::vector<clipp::detail::match_t,_std::allocator<clipp::detail::match_t>_>_>
    ::operator++(&__end2_1);
  }
  this_local._7_1_ = 1;
  goto LAB_0011e7f7;
}

Assistant:

bool try_match_joined(const group& joinGroup, arg_string arg,
                          const ParamSelector& select,
                          const arg_string& prefix = "")
    {
        //temporary parser with 'joinGroup' as top-level group
        parser parse {joinGroup};
        //records temporary matches
        std::vector<match_t> matches;

        while(!arg.empty()) {
            auto match = detail::longest_prefix_match(parse.pos_, arg, select);

            if(!match) return false;

            arg.erase(0, match.str().size());
            //make sure prefix is always present after the first match
            //so that, e.g., flags "-a" and "-b" will be found in "-ab"
            if(!arg.empty() && !prefix.empty() && arg.find(prefix) != 0 &&
                prefix != match.str())
            {
                arg.insert(0,prefix);
            }

            parse.add_match(match);
            matches.push_back(std::move(match));
        }

        if(!arg.empty() || matches.empty()) return false;

        if(!parse.missCand_.empty()) return false;
        for(const auto& a : parse.args_) if(a.any_error()) return false;

        //replay matches onto *this
        for(const auto& m : matches) add_match(m);
        return true;
    }